

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::IssueCMP0095Warning(cmInstallTargetGenerator *this,string *unescapedRpath)

{
  cmake *this_00;
  long lVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *pcVar4;
  PolicyID id;
  string sStack_1a8;
  ostringstream w;
  
  lVar1 = std::__cxx11::string::find((char *)unescapedRpath,0x5a0eb7);
  if (lVar1 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1a8,(cmPolicies *)0x5f,id);
    poVar2 = std::operator<<((ostream *)&w,(string *)&sStack_1a8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&sStack_1a8);
    poVar2 = std::operator<<((ostream *)&w,"RPATH entries for target \'");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\' ");
    poVar2 = std::operator<<(poVar2,"will not be escaped in the intermediary ");
    std::operator<<(poVar2,"cmake_install.cmake script.");
    pcVar4 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
    this_00 = pcVar4->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&sStack_1a8,
                        &(this->super_cmInstallGenerator).Backtrace);
    std::__cxx11::string::~string((string *)&sStack_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::IssueCMP0095Warning(
  const std::string& unescapedRpath)
{
  // Reduce warning noise to cases where used RPATHs may actually be affected
  // by CMP0095. This filter is meant to skip warnings in cases when
  // non-curly-braces syntax (e.g. $ORIGIN) or no keyword is used which has
  // worked already before CMP0095. We intend to issue a warning in all cases
  // with curly-braces syntax, even if the workaround of double-escaping is in
  // place, since we deprecate the need for it with CMP0095.
  const bool potentially_affected(unescapedRpath.find("${") !=
                                  std::string::npos);

  if (potentially_affected) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0095) << "\n";
    w << "RPATH entries for target '" << this->Target->GetName() << "' "
      << "will not be escaped in the intermediary "
      << "cmake_install.cmake script.";
    this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());
  }
}